

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
* testing::anon_unknown_6::UninterestingCallReactionMap(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::UninterestingCallReactionMap()::map == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::UninterestingCallReactionMap()::map);
    if (iVar1 != 0) {
      UninterestingCallReactionMap::map =
           (unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
            *)operator_new(0x38);
      (UninterestingCallReactionMap::map->_M_h)._M_buckets =
           &(UninterestingCallReactionMap::map->_M_h)._M_single_bucket;
      (UninterestingCallReactionMap::map->_M_h)._M_bucket_count = 1;
      (UninterestingCallReactionMap::map->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (UninterestingCallReactionMap::map->_M_h)._M_element_count = 0;
      (UninterestingCallReactionMap::map->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
      (UninterestingCallReactionMap::map->_M_h)._M_rehash_policy._M_next_resize = 0;
      (UninterestingCallReactionMap::map->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      __cxa_guard_release(&(anonymous_namespace)::UninterestingCallReactionMap()::map);
    }
  }
  return UninterestingCallReactionMap::map;
}

Assistant:

std::unordered_map<uintptr_t, internal::CallReaction>&
UninterestingCallReactionMap() {
  static auto* map = new std::unordered_map<uintptr_t, internal::CallReaction>;
  return *map;
}